

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_hex_integer<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  size_type sVar2;
  long lVar3;
  string *str_00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  this;
  iterator loc_00;
  value_type *pvVar5;
  context<toml::type_config> *in_RDX;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_RDI;
  result<long,_toml::error_info> val;
  bool upper_found;
  bool lower_not_found;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  first_underscore;
  integer_format_info fmt;
  string str;
  region reg;
  spec *spec;
  location first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff738;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_stack_fffffffffffff740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff748;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff750;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff758;
  undefined7 in_stack_fffffffffffff760;
  undefined1 in_stack_fffffffffffff767;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff768;
  __const_iterator in_stack_fffffffffffff770;
  __const_iterator in_stack_fffffffffffff778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff780;
  region *in_stack_fffffffffffff798;
  error_info *v;
  region *r;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff7c8;
  integer_format_info *fmt_00;
  undefined1 *x;
  basic_value<toml::type_config> *this_01;
  uint8_t base;
  source_location *src;
  basic_value<toml::type_config> *in_stack_fffffffffffff828;
  location *in_stack_fffffffffffff830;
  sequence *in_stack_fffffffffffff838;
  spec *in_stack_fffffffffffff858;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_718 [7];
  string *in_stack_fffffffffffff990;
  location *in_stack_fffffffffffff998;
  sequence *in_stack_fffffffffffff9a0;
  string *in_stack_fffffffffffff9a8;
  result<long,_toml::error_info> local_458;
  char *local_3f8;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  byte local_3c9;
  char *local_3c8;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  byte local_399;
  char *local_398;
  char *local_390;
  undefined1 local_379;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_358;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_320;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_310 [3];
  undefined1 local_2f1;
  undefined1 local_2f0 [104];
  undefined1 local_288 [39];
  allocator<char> local_261 [144];
  allocator<char> local_1d1 [361];
  spec *local_68;
  context<toml::type_config> *local_18;
  
  local_18 = in_RDX;
  location::location((location *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
                     (location *)in_stack_fffffffffffff758._M_current);
  local_68 = context<toml::type_config>::toml_spec(local_18);
  syntax::hex_int(in_stack_fffffffffffff858);
  sequence::scan(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
  sequence::~sequence((sequence *)in_stack_fffffffffffff740);
  bVar1 = region::is_ok((region *)0x759e3c);
  if (bVar1) {
    region::as_string_abi_cxx11_(in_stack_fffffffffffff798);
    integer_format_info::integer_format_info
              ((integer_format_info *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760))
    ;
    local_2f0[0x30] = 3;
    src = (source_location *)local_288;
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)src);
    lVar3 = sVar2 - 2;
    local_2f0._40_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_fffffffffffff738._M_current);
    local_2f0._32_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                   (in_stack_fffffffffffff748);
    local_2f0[0x1f] = 0x5f;
    _Var4._M_current._7_1_ = in_stack_fffffffffffff767;
    _Var4._M_current._0_7_ = in_stack_fffffffffffff760;
    str_00 = (string *)
             std::count<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                       (_Var4,in_stack_fffffffffffff758,in_stack_fffffffffffff750._M_current);
    local_2f0._56_8_ = lVar3 - (long)str_00;
    x = local_2f0 + 8;
    fmt_00 = (integer_format_info *)local_288;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rbegin
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff748);
    base = (uint8_t)((ulong)lVar3 >> 0x38);
    this_01 = (basic_value<toml::type_config> *)local_2f0;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rend
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff748);
    local_2f1 = 0x5f;
    std::find<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,char>
              ((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff778._M_current,
               (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff770._M_current,(char *)in_stack_fffffffffffff768);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rend
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff748);
    bVar1 = std::
            operator==<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffff750._M_current,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffff748);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rbegin
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff748);
      CLI::std::
      reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reverse_iterator(local_310,
                         (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(local_2f0 + 0x10));
      in_stack_fffffffffffff7c8 =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)std::
              distance<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
                        ((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
                         (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffff758._M_current);
      local_2f0._64_8_ = in_stack_fffffffffffff7c8;
    }
    r = (region *)local_288;
    local_320 = (char *)std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                  (in_stack_fffffffffffff738._M_current);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff740,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff738._M_current);
    local_340 = (char *)std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                  (in_stack_fffffffffffff738._M_current);
    _Var4 = std::next<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                      (in_stack_fffffffffffff738,0x75a354);
    local_338 = _Var4._M_current;
    local_348 = (char *)std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                  (in_stack_fffffffffffff748);
    this = std::
           find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,toml::detail::parse_hex_integer<toml::type_config>(toml::detail::location&,toml::detail::context<toml::type_config>const&)::_lambda(char)_1_>
                     (local_338,local_348);
    local_330 = this._M_current;
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff740,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff738._M_current);
    loc_00 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             erase(in_stack_fffffffffffff768,in_stack_fffffffffffff778,in_stack_fffffffffffff770);
    v = (error_info *)local_288;
    local_358 = loc_00._M_current;
    local_370 = (char *)std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                  (in_stack_fffffffffffff738._M_current);
    local_378 = (char *)std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                  (in_stack_fffffffffffff748);
    local_379 = 0x5f;
    local_368 = (char *)std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                                  (in_stack_fffffffffffff758,in_stack_fffffffffffff750,
                                   (char *)in_stack_fffffffffffff748);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff740,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff738._M_current);
    local_390 = (char *)std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                  (in_stack_fffffffffffff748);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff740,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff738._M_current);
    local_398 = (char *)CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                                  (in_stack_fffffffffffff768,in_stack_fffffffffffff778,
                                   in_stack_fffffffffffff770);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x75a4d6
                      );
    if (bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff740,in_stack_fffffffffffff738._M_current);
    }
    local_3b0 = (char *)std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                  (in_stack_fffffffffffff738._M_current);
    local_3b8 = (char *)std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                  (in_stack_fffffffffffff748);
    local_3a8 = (char *)std::
                        find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,toml::detail::parse_hex_integer<toml::type_config>(toml::detail::location&,toml::detail::context<toml::type_config>const&)::_lambda(char)_2_>
                                  (local_3b0,local_3b8);
    local_3c8 = (char *)std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                  (in_stack_fffffffffffff748);
    local_399 = __gnu_cxx::
                operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffff740,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffff738._M_current);
    local_3e0 = (char *)std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                  (in_stack_fffffffffffff738._M_current);
    local_3e8 = (char *)std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                  (in_stack_fffffffffffff748);
    local_3d8 = (char *)std::
                        find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,toml::detail::parse_hex_integer<toml::type_config>(toml::detail::location&,toml::detail::context<toml::type_config>const&)::_lambda(char)_3_>
                                  (local_3e0,local_3e8);
    local_3f8 = (char *)std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                  (in_stack_fffffffffffff748);
    bVar1 = __gnu_cxx::
            operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffff740,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffff738._M_current);
    local_3c9 = (bVar1 ^ 0xffU) & 1;
    local_2f0[0x31] = 1;
    if ((local_399 & 1) == 0) {
      local_2f0[0x31] = local_3c9;
    }
    region::region((region *)this._M_current,(location *)loc_00._M_current);
    source_location::source_location((source_location *)_Var4._M_current,r);
    type_config::parse_int(str_00,src,base);
    source_location::~source_location((source_location *)in_stack_fffffffffffff740);
    region::~region((region *)in_stack_fffffffffffff740);
    bVar1 = result<long,_toml::error_info>::is_ok(&local_458);
    if (bVar1) {
      pvVar5 = result<long,_toml::error_info>::as_ok((result<long,_toml::error_info> *)0x75a6b8);
      in_stack_fffffffffffff740 =
           (result<toml::basic_value<toml::type_config>,_toml::error_info> *)*pvVar5;
      integer_format_info::integer_format_info
                ((integer_format_info *)in_stack_fffffffffffff740,
                 (integer_format_info *)in_stack_fffffffffffff738._M_current);
      local_718[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_718[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_718[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_00 = local_718;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x75a703);
      region::region((region *)in_stack_fffffffffffff740,
                     (region *)in_stack_fffffffffffff738._M_current);
      basic_value<toml::type_config>::basic_value
                (this_01,(integer_type)x,fmt_00,in_stack_fffffffffffff7c8,
                 (region_type *)_Var4._M_current);
      ok<toml::basic_value<toml::type_config>>(in_stack_fffffffffffff828);
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                (in_stack_fffffffffffff740,(success_type *)in_stack_fffffffffffff738._M_current);
      success<toml::basic_value<toml::type_config>_>::~success
                ((success<toml::basic_value<toml::type_config>_> *)0x75a77b);
      basic_value<toml::type_config>::~basic_value
                ((basic_value<toml::type_config> *)in_stack_fffffffffffff740);
      region::~region((region *)in_stack_fffffffffffff740);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(this_00);
      integer_format_info::~integer_format_info((integer_format_info *)0x75a7af);
    }
    else {
      location::operator=((location *)in_stack_fffffffffffff740,
                          (location *)in_stack_fffffffffffff738._M_current);
      result<long,_toml::error_info>::as_err((result<long,_toml::error_info> *)0x75a8b2);
      err<toml::error_info_const&>(v);
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                (in_stack_fffffffffffff740,(failure_type *)in_stack_fffffffffffff738._M_current);
      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x75a8e8);
    }
    local_288._32_4_ = 1;
    result<long,_toml::error_info>::~result((result<long,_toml::error_info> *)0x75a93b);
    integer_format_info::~integer_format_info((integer_format_info *)0x75a948);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff740);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff780,in_stack_fffffffffffff778._M_current,
               (allocator<char> *)in_stack_fffffffffffff770._M_current);
    syntax::hex_int(in_stack_fffffffffffff858);
    location::location((location *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
                       (location *)in_stack_fffffffffffff758._M_current);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff780,in_stack_fffffffffffff778._M_current,
               (allocator<char> *)in_stack_fffffffffffff770._M_current);
    make_syntax_error<toml::detail::sequence>
              (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
               in_stack_fffffffffffff990);
    err<toml::error_info>((error_info *)in_stack_fffffffffffff798);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (in_stack_fffffffffffff740,(failure_type *)in_stack_fffffffffffff738._M_current);
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x759f48);
    error_info::~error_info((error_info *)in_stack_fffffffffffff740);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff740);
    std::allocator<char>::~allocator(local_261);
    location::~location((location *)in_stack_fffffffffffff740);
    sequence::~sequence((sequence *)in_stack_fffffffffffff740);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff740);
    std::allocator<char>::~allocator(local_1d1);
    local_288._32_4_ = 1;
  }
  region::~region((region *)in_stack_fffffffffffff740);
  location::~location((location *)in_stack_fffffffffffff740);
  return in_RDI;
}

Assistant:

result<basic_value<TC>, error_info>
parse_hex_integer(location& loc, const context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();
    auto reg = syntax::hex_int(spec).scan(loc);
    if( ! reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_hex_integer: "
            "invalid integer: hex_int must be like: 0xC0FFEE, 0xdead_beef",
            syntax::hex_int(spec), loc));
    }

    auto str = reg.as_string();

    integer_format_info fmt;
    fmt.fmt   = integer_format::hex;
    fmt.width = str.size() - 2 - static_cast<std::size_t>(std::count(str.begin(), str.end(), '_'));

    const auto first_underscore = std::find(str.rbegin(), str.rend(), '_');
    if(first_underscore != str.rend())
    {
        fmt.spacer = static_cast<std::size_t>(std::distance(str.rbegin(), first_underscore));
    }

    // skip prefix `0x` and zeros and underscores at the MSB
    str.erase(str.begin(), std::find_if(
                std::next(str.begin(), 2), str.end(), [](const char c) {
                    return c != '0' && c != '_';
                }));

    // remove all `_` before calling TC::parse_int
    str.erase(std::remove(str.begin(), str.end(), '_'), str.end());

    // 0x0000_0000 becomes empty.
    if(str.empty()) { str = "0"; }

    // prefix zero and _ is removed. check if it uses upper/lower case.
    // if both upper and lower case letters are found, set upper=true.
    const auto lower_not_found = std::find_if(str.begin(), str.end(),
        [](const char c) { return std::islower(static_cast<int>(c)) != 0; }) == str.end();
    const auto upper_found = std::find_if(str.begin(), str.end(),
        [](const char c) { return std::isupper(static_cast<int>(c)) != 0; }) != str.end();
    fmt.uppercase = lower_not_found || upper_found;

    const auto val = TC::parse_int(str, source_location(region(loc)), 16);
    if(val.is_ok())
    {
        return ok(basic_value<TC>(val.as_ok(), std::move(fmt), {}, std::move(reg)));
    }
    else
    {
        loc = first;
        return err(val.as_err());
    }
}